

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char,char_const*&,char>
                   (string *__return_storage_ptr__,char *a,char **b,char *args)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_118;
  cmAlphaNum local_e0;
  cmAlphaNum local_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_70;
  string_view local_58;
  string *local_48;
  string_view local_40;
  string *local_30;
  
  local_e0.Digits_[0] = *a;
  local_e0.View_._M_str = local_e0.Digits_;
  local_e0.RValueString_ = (string *)0x0;
  local_e0.View_._M_len = 1;
  local_70.first = cmAlphaNum::View(&local_e0);
  local_70.second = local_e0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_a8,*b);
  local_58 = cmAlphaNum::View(&local_a8);
  local_48 = local_a8.RValueString_;
  local_118.Digits_[0] = *args;
  local_118.View_._M_str = local_118.Digits_;
  local_118.RValueString_ = (string *)0x0;
  local_118.View_._M_len = 1;
  local_40 = cmAlphaNum::View(&local_118);
  local_30 = local_118.RValueString_;
  views._M_len = 3;
  views._M_array = &local_70;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}